

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_cast.hpp
# Opt level: O0

Result_Type
chaiscript::
boxed_cast<std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>*>
          (Boxed_Value *bv,Type_Conversions_State *t_conversions)

{
  bool bVar1;
  Result_Type pvVar2;
  undefined8 uVar3;
  Type_Info *pTVar4;
  long in_RSI;
  bad_any_cast *anon_var_0_1;
  bad_any_cast *anon_var_0;
  Type_Conversions_State *in_stack_fffffffffffffec8;
  Boxed_Value *in_stack_fffffffffffffed0;
  Type_Info *in_stack_fffffffffffffed8;
  Type_Info *in_stack_fffffffffffffee0;
  Type_Conversions *in_stack_fffffffffffffef0;
  byte local_c9;
  byte local_b9;
  Type_Info in_stack_ffffffffffffff60;
  Boxed_Value *in_stack_ffffffffffffffb8;
  Conversion_Saves *in_stack_ffffffffffffffc0;
  Type_Conversions *in_stack_ffffffffffffffc8;
  
  local_b9 = 1;
  if (in_RSI != 0) {
    Boxed_Value::get_type_info((Boxed_Value *)0x3e2665);
    user_type<std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>*>();
    bVar1 = Type_Info::bare_equal(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
    local_b9 = 1;
    if (!bVar1) {
      local_c9 = 0;
      if (in_RSI != 0) {
        Type_Conversions_State::operator->((Type_Conversions_State *)0x3e26b4);
        bVar1 = Type_Conversions::
                convertable_type<std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>*>
                          (in_stack_fffffffffffffef0);
        local_c9 = bVar1 ^ 0xff;
      }
      local_b9 = local_c9;
    }
  }
  if ((local_b9 & 1) == 0) {
    if (in_RSI != 0) {
      Type_Conversions_State::operator->((Type_Conversions_State *)0x3e2762);
      bVar1 = Type_Conversions::
              convertable_type<std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>*>
                        (in_stack_fffffffffffffef0);
      if (bVar1) {
        Type_Conversions_State::operator->((Type_Conversions_State *)0x3e2780);
        Type_Conversions_State::saves((Type_Conversions_State *)0x3e2792);
        Type_Conversions::
        boxed_type_conversion<std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>*>
                  (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
        pvVar2 = detail::
                 Cast_Helper<std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>_*>
                 ::cast(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
        Boxed_Value::~Boxed_Value((Boxed_Value *)0x3e27e7);
        return pvVar2;
      }
    }
    uVar3 = __cxa_allocate_exception(0x48);
    pTVar4 = Boxed_Value::get_type_info((Boxed_Value *)0x3e2a1e);
    exception::bad_boxed_cast::bad_boxed_cast
              ((bad_boxed_cast *)pTVar4->m_bare_type_info,in_stack_ffffffffffffff60,
               pTVar4->m_type_info);
    __cxa_throw(uVar3,&exception::bad_boxed_cast::typeinfo,
                exception::bad_boxed_cast::~bad_boxed_cast);
  }
  pvVar2 = detail::
           Cast_Helper<std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>_*>
           ::cast(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  return pvVar2;
}

Assistant:

typename detail::Cast_Helper<Type>::Result_Type boxed_cast(const Boxed_Value &bv, const Type_Conversions_State *t_conversions = nullptr)
  {
    if (!t_conversions || bv.get_type_info().bare_equal(user_type<Type>()) || (t_conversions && !(*t_conversions)->convertable_type<Type>())) {
      try {
        return detail::Cast_Helper<Type>::cast(bv, t_conversions);
      } catch (const chaiscript::detail::exception::bad_any_cast &) {
      }
    }


    if (t_conversions && (*t_conversions)->convertable_type<Type>())
    {
      try {
        // std::cout << "trying an up conversion " << typeid(Type).name() << '\n';
        // We will not catch any bad_boxed_dynamic_cast that is thrown, let the user get it
        // either way, we are not responsible if it doesn't work
        return detail::Cast_Helper<Type>::cast((*t_conversions)->boxed_type_conversion<Type>(t_conversions->saves(), bv), t_conversions);
      } catch (...) {
        try {
        //  std::cout << "trying a down conversion " << typeid(Type).name() << '\n';
          // try going the other way - down the inheritance graph
          return detail::Cast_Helper<Type>::cast((*t_conversions)->boxed_type_down_conversion<Type>(t_conversions->saves(), bv), t_conversions);
        } catch (const chaiscript::detail::exception::bad_any_cast &) {
          throw exception::bad_boxed_cast(bv.get_type_info(), typeid(Type));
        }
      }
    } else {
      // If it's not polymorphic, just throw the error, don't waste the time on the 
      // attempted dynamic_cast
      throw exception::bad_boxed_cast(bv.get_type_info(), typeid(Type));
    }

  }